

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O1

size_t Diligent::ShaderResourceCacheGL::GetRequiredMemorySize(TResourceCount *ResCount)

{
  ulong uVar1;
  string msg;
  string local_30;
  
  uVar1 = (ulong)ResCount->_M_elems[3] * 0x10 +
          ((ulong)ResCount->_M_elems[2] +
          (ulong)ResCount->_M_elems[1] + (ulong)ResCount->_M_elems[0]) * 0x18;
  if (0xfffe < uVar1) {
    FormatString<char[45]>(&local_30,(char (*) [45])"Memory size exceed the maximum allowed size.");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRequiredMemorySize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar1;
}

Assistant:

size_t ShaderResourceCacheGL::GetRequiredMemorySize(const TResourceCount& ResCount)
{
    static_assert(std::is_same<TResourceCount, PipelineResourceSignatureGLImpl::TBindings>::value,
                  "ShaderResourceCacheGL::TResourceCount must be the same type as PipelineResourceSignatureGLImpl::TBindings");
    // clang-format off
    auto MemSize =
                sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER] +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]        +
                sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]          +
                sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER];
    // clang-format on
    VERIFY(MemSize < InvalidResourceOffset, "Memory size exceed the maximum allowed size.");
    return MemSize;
}